

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_io.cc
# Opt level: O1

bool __thiscall gimage::JPEGImageIO::handlesFile(JPEGImageIO *this,char *name,bool reading)

{
  long lVar1;
  bool bVar2;
  string s;
  allocator local_29;
  undefined1 *local_28;
  ulong local_20;
  undefined1 local_18 [16];
  
  std::__cxx11::string::string((string *)&local_28,name,&local_29);
  if (local_20 < 5) {
    bVar2 = false;
  }
  else {
    lVar1 = std::__cxx11::string::rfind((char *)&local_28,0x12fbb9,0xffffffffffffffff);
    bVar2 = true;
    if (lVar1 != local_20 - 4) {
      lVar1 = std::__cxx11::string::rfind((char *)&local_28,0x12fbbe,0xffffffffffffffff);
      bVar2 = lVar1 == local_20 - 4;
    }
  }
  if (local_28 != local_18) {
    operator_delete(local_28);
  }
  return bVar2;
}

Assistant:

bool JPEGImageIO::handlesFile(const char *name, bool reading) const
{
  std::string s=name;

  if (s.size() <= 4)
  {
    return false;
  }

  if (s.rfind(".jpg") == s.size()-4 || s.rfind(".JPG") == s.size()-4)
  {
    return true;
  }

  return false;
}